

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O1

void __thiscall PatchNewGame::inject_code(PatchNewGame *this,ROM *rom,World *world)

{
  uint8_t byte;
  Code *pCVar1;
  Param local_a8;
  uint32_t local_a0;
  undefined4 local_9c;
  Code local_98;
  
  md::ROM::set_word(rom,0x27f4,world->_spawn_map_id);
  md::ROM::set_byte(rom,0x27fd,world->_spawn_position_x);
  md::ROM::set_byte(rom,0x2805,world->_spawn_position_y);
  byte = world->_starting_life + 0xff;
  md::ROM::set_byte(rom,0x27b4,byte);
  md::ROM::set_byte(rom,0x27bc,byte);
  local_a0 = inject_func_init_game(this,rom,world);
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_9c = 2;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jsr(&local_98,&local_a8);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code(rom,0x2700,pCVar1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        // Edit spawn map and position
        rom.set_word(0x0027F4, world.spawn_map_id());
        rom.set_byte(0x0027FD, world.spawn_position_x());
        rom.set_byte(0x002805, world.spawn_position_y());

        // Edit starting life
        uint8_t starting_life = world.starting_life();
        rom.set_byte(0x0027B4, starting_life-1);
        rom.set_byte(0x0027BC, starting_life-1);

        // Inject a function initializing everyhting properly on new game (flags...)
        uint32_t func_init_game = inject_func_init_game(rom, world);
        rom.set_code(0x002700, md::Code().jsr(func_init_game).nop());
        // Replace the bitset of the "no music flag" by a jump to 'func_init_game'
        // 0x002700:
        // Before: 	[08F9] bset 3 -> $FF1027
        // After:	[4EB9] jsr func_init_game ; [4E71] nop
    }